

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TxFormats.cpp
# Opt level: O3

void __thiscall jbcoin::TxFormats::TxFormats(TxFormats *this)

{
  _Rb_tree_header *p_Var1;
  Item *pIVar2;
  SOElement local_c0;
  SOElement local_b0;
  SOElement local_a0;
  SOElement local_90;
  SOElement local_80;
  SOElement local_70;
  SOElement local_60;
  SOElement local_50;
  SOElement local_40;
  
  (this->super_KnownFormats<jbcoin::TxType>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_KnownFormats<jbcoin::TxType>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_KnownFormats<jbcoin::TxType>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::TxType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::TxType>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->super_KnownFormats<jbcoin::TxType>).m_names._M_t._M_impl.super__Rb_tree_header;
  (this->super_KnownFormats<jbcoin::TxType>).m_names._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_KnownFormats<jbcoin::TxType>).m_names._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_KnownFormats<jbcoin::TxType>).m_names._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::TxType>).m_names._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::TxType>).m_names._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var1 = &(this->super_KnownFormats<jbcoin::TxType>).m_types._M_t._M_impl.super__Rb_tree_header;
  (this->super_KnownFormats<jbcoin::TxType>).m_types._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_KnownFormats<jbcoin::TxType>).m_types._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_KnownFormats<jbcoin::TxType>).m_types._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::TxType>).m_types._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::TxType>).m_types._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_KnownFormats<jbcoin::TxType>)._vptr_KnownFormats =
       (_func_int **)&PTR_addCommonFields_002d2ed8;
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"AccountSet",ttACCOUNT_SET);
  local_c0.e_field = (SField *)sfEmailHash;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfWalletLocator;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfWalletSize;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfMessageKey;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_80.e_field = (SField *)sfDomain;
  local_80.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  local_70.e_field = (SField *)sfTransferRate;
  local_70.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_70);
  local_60.e_field = (SField *)sfSetFlag;
  local_60.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_60);
  local_40.e_field = (SField *)sfClearFlag;
  local_40.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_40);
  local_50.e_field = (SField *)sfTickSize;
  local_50.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_50);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"TrustSet",ttTRUST_SET);
  local_c0.e_field = (SField *)sfLimitAmount;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfQualityIn;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfQualityOut;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"OfferCreate",ttOFFER_CREATE);
  local_c0.e_field = (SField *)sfTakerPays;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfTakerGets;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfExpiration;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfOfferSequence;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"OfferCancel",ttOFFER_CANCEL);
  local_c0.e_field = (SField *)sfOfferSequence;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"SetRegularKey",ttREGULAR_KEY_SET);
  local_c0.e_field = (SField *)sfRegularKey;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"Payment",ttPAYMENT);
  local_c0.e_field = (SField *)sfDestination;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfAmount;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfSendMax;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfPaths;
  local_90.flags = SOE_DEFAULT;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_80.e_field = (SField *)sfInvoiceID;
  local_80.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  local_70.e_field = (SField *)sfDestinationTag;
  local_70.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_70);
  local_60.e_field = (SField *)sfDeliverMin;
  local_60.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_60);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EscrowCreate",ttESCROW_CREATE);
  local_c0.e_field = (SField *)sfDestination;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfAmount;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfCondition;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfCancelAfter;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_80.e_field = (SField *)sfFinishAfter;
  local_80.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  local_70.e_field = (SField *)sfDestinationTag;
  local_70.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_70);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EscrowFinish",ttESCROW_FINISH);
  local_c0.e_field = (SField *)sfOwner;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfOfferSequence;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfFulfillment;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfCondition;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EscrowCancel",ttESCROW_CANCEL);
  local_c0.e_field = (SField *)sfOwner;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfOfferSequence;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EnableAmendment",ttAMENDMENT);
  local_c0.e_field = (SField *)sfLedgerSequence;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfAmendment;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"SetFee",ttFEE);
  local_c0.e_field = (SField *)sfLedgerSequence;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfBaseFee;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfReferenceFeeUnits;
  local_a0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfReserveBase;
  local_90.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_80.e_field = (SField *)sfReserveIncrement;
  local_80.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"TicketCreate",ttTICKET_CREATE);
  local_c0.e_field = (SField *)sfTarget;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfExpiration;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"TicketCancel",ttTICKET_CANCEL);
  local_c0.e_field = (SField *)sfTicketID;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"SignerListSet",ttSIGNER_LIST_SET);
  local_c0.e_field = (SField *)sfSignerQuorum;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfSignerEntries;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"PaymentChannelCreate",
                      ttPAYCHAN_CREATE);
  local_c0.e_field = (SField *)sfDestination;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfAmount;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfSettleDelay;
  local_a0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfPublicKey;
  local_90.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_80.e_field = (SField *)sfCancelAfter;
  local_80.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  local_70.e_field = (SField *)sfDestinationTag;
  local_70.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_70);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"PaymentChannelFund",ttPAYCHAN_FUND)
  ;
  local_c0.e_field = (SField *)sfPayChannel;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfAmount;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfExpiration;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  pIVar2 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"PaymentChannelClaim",
                      ttPAYCHAN_CLAIM);
  local_c0.e_field = (SField *)sfPayChannel;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_b0.e_field = (SField *)sfAmount;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_a0.e_field = (SField *)sfBalance;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_90.e_field = (SField *)sfSignature;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_80.e_field = (SField *)sfPublicKey;
  local_80.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  return;
}

Assistant:

TxFormats::TxFormats ()
{
    add ("AccountSet", ttACCOUNT_SET)
        << SOElement (sfEmailHash,           SOE_OPTIONAL)
        << SOElement (sfWalletLocator,       SOE_OPTIONAL)
        << SOElement (sfWalletSize,          SOE_OPTIONAL)
        << SOElement (sfMessageKey,          SOE_OPTIONAL)
        << SOElement (sfDomain,              SOE_OPTIONAL)
        << SOElement (sfTransferRate,        SOE_OPTIONAL)
        << SOElement (sfSetFlag,             SOE_OPTIONAL)
        << SOElement (sfClearFlag,           SOE_OPTIONAL)
        << SOElement (sfTickSize,            SOE_OPTIONAL)
        ;

    add ("TrustSet", ttTRUST_SET)
        << SOElement (sfLimitAmount,         SOE_OPTIONAL)
        << SOElement (sfQualityIn,           SOE_OPTIONAL)
        << SOElement (sfQualityOut,          SOE_OPTIONAL)
        ;

    add ("OfferCreate", ttOFFER_CREATE)
        << SOElement (sfTakerPays,           SOE_REQUIRED)
        << SOElement (sfTakerGets,           SOE_REQUIRED)
        << SOElement (sfExpiration,          SOE_OPTIONAL)
        << SOElement (sfOfferSequence,       SOE_OPTIONAL)
        ;

    add ("OfferCancel", ttOFFER_CANCEL)
        << SOElement (sfOfferSequence,       SOE_REQUIRED)
        ;

    add ("SetRegularKey", ttREGULAR_KEY_SET)
        << SOElement (sfRegularKey,          SOE_OPTIONAL)
        ;

    add ("Payment", ttPAYMENT)
        << SOElement (sfDestination,         SOE_REQUIRED)
        << SOElement (sfAmount,              SOE_REQUIRED)
        << SOElement (sfSendMax,             SOE_OPTIONAL)
        << SOElement (sfPaths,               SOE_DEFAULT)
        << SOElement (sfInvoiceID,           SOE_OPTIONAL)
        << SOElement (sfDestinationTag,      SOE_OPTIONAL)
        << SOElement (sfDeliverMin,          SOE_OPTIONAL)
        ;

    add ("EscrowCreate", ttESCROW_CREATE) <<
        SOElement (sfDestination,       SOE_REQUIRED) <<
        SOElement (sfAmount,            SOE_REQUIRED) <<
        SOElement (sfCondition,         SOE_OPTIONAL) <<
        SOElement (sfCancelAfter,       SOE_OPTIONAL) <<
        SOElement (sfFinishAfter,       SOE_OPTIONAL) <<
        SOElement (sfDestinationTag,    SOE_OPTIONAL);

    add ("EscrowFinish", ttESCROW_FINISH) <<
        SOElement (sfOwner,               SOE_REQUIRED) <<
        SOElement (sfOfferSequence,       SOE_REQUIRED) <<
        SOElement (sfFulfillment,         SOE_OPTIONAL) <<
        SOElement (sfCondition,           SOE_OPTIONAL);

    add ("EscrowCancel", ttESCROW_CANCEL) <<
        SOElement (sfOwner,               SOE_REQUIRED) <<
        SOElement (sfOfferSequence,       SOE_REQUIRED);

    add ("EnableAmendment", ttAMENDMENT)
        << SOElement (sfLedgerSequence,      SOE_REQUIRED)
        << SOElement (sfAmendment,           SOE_REQUIRED)
        ;

    add ("SetFee", ttFEE)
        << SOElement (sfLedgerSequence,      SOE_OPTIONAL)
        << SOElement (sfBaseFee,             SOE_REQUIRED)
        << SOElement (sfReferenceFeeUnits,   SOE_REQUIRED)
        << SOElement (sfReserveBase,         SOE_REQUIRED)
        << SOElement (sfReserveIncrement,    SOE_REQUIRED)
        ;

    add ("TicketCreate", ttTICKET_CREATE)
        << SOElement (sfTarget,              SOE_OPTIONAL)
        << SOElement (sfExpiration,          SOE_OPTIONAL)
        ;

    add ("TicketCancel", ttTICKET_CANCEL)
        << SOElement (sfTicketID,            SOE_REQUIRED)
        ;

    // The SignerEntries are optional because a SignerList is deleted by
    // setting the SignerQuorum to zero and omitting SignerEntries.
    add ("SignerListSet", ttSIGNER_LIST_SET)
        << SOElement (sfSignerQuorum,        SOE_REQUIRED)
        << SOElement (sfSignerEntries,       SOE_OPTIONAL)
        ;

    add ("PaymentChannelCreate", ttPAYCHAN_CREATE) <<
            SOElement (sfDestination,       SOE_REQUIRED) <<
            SOElement (sfAmount,            SOE_REQUIRED) <<
            SOElement (sfSettleDelay,       SOE_REQUIRED) <<
            SOElement (sfPublicKey,         SOE_REQUIRED) <<
            SOElement (sfCancelAfter,       SOE_OPTIONAL) <<
            SOElement (sfDestinationTag,    SOE_OPTIONAL);

    add ("PaymentChannelFund", ttPAYCHAN_FUND) <<
            SOElement (sfPayChannel,        SOE_REQUIRED) <<
            SOElement (sfAmount,            SOE_REQUIRED) <<
            SOElement (sfExpiration,        SOE_OPTIONAL);

    add ("PaymentChannelClaim", ttPAYCHAN_CLAIM) <<
            SOElement (sfPayChannel,        SOE_REQUIRED) <<
            SOElement (sfAmount,            SOE_OPTIONAL) <<
            SOElement (sfBalance,           SOE_OPTIONAL) <<
            SOElement (sfSignature,         SOE_OPTIONAL) <<
            SOElement (sfPublicKey,         SOE_OPTIONAL);
}